

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# license_test.cpp
# Opt level: O0

void __thiscall license::test::license_stdout::test_method(license_stdout *this)

{
  unit_test_log_t *puVar1;
  bool bVar2;
  streambuf *new_buffer;
  string *project_folder;
  long lVar3;
  lazy_ostream *prev;
  basic_cstring<const_char> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_328;
  assertion_result local_308;
  basic_cstring<const_char> local_2f0;
  basic_cstring<const_char> local_2e0;
  undefined1 local_2d0 [8];
  string stdout_str;
  string local_2a8;
  allocator local_281;
  string local_280;
  undefined1 local_260 [8];
  License license;
  cout_redirect local_1a8;
  cout_redirect guard;
  output_test_stream local_190 [8];
  output_test_stream output;
  license_stdout *this_local;
  
  boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)&guard);
  boost::test_tools::output_test_stream::output_test_stream
            (local_190,(basic_cstring<const_char> *)&guard,1);
  new_buffer = (streambuf *)std::__cxx11::ostringstream::rdbuf();
  cout_redirect::cout_redirect(&local_1a8,new_buffer);
  project_folder = boost::filesystem::path::string_abi_cxx11_((path *)MyGlobalFixture::project_path)
  ;
  License::License((License *)local_260,(string *)0x0,project_folder,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_280,"feature-names",&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2a8,"my_fantastic_softwAre",
             (allocator *)(stdout_str.field_2._M_local_buf + 0xf));
  License::add_parameter((License *)local_260,&local_280,&local_2a8);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator((allocator<char> *)(stdout_str.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  License::write_license((License *)local_260);
  License::~License((License *)local_260);
  cout_redirect::~cout_redirect(&local_1a8);
  std::__cxx11::ostringstream::str();
  do {
    puVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2e0,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/license_test.cpp"
               ,0x81);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(puVar1,&local_2e0,0x6d,&local_2f0);
    lVar3 = std::__cxx11::string::find(local_2d0,0x43d275);
    boost::test_tools::assertion_result::assertion_result(&local_308,lVar3 != -1);
    prev = boost::unit_test::lazy_ostream::instance();
    std::operator+(&local_348,"license has been written to stdout ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
    boost::unit_test::operator<<(&local_328,prev,&local_348);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_358,
               "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/test/license_test.cpp"
               ,0x81);
    boost::test_tools::tt_detail::report_assertion(&local_308,&local_328,&local_358,0x6d,1,1,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl(&local_328);
    std::__cxx11::string::~string((string *)&local_348);
    boost::test_tools::assertion_result::~assertion_result(&local_308);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::__cxx11::string::~string((string *)local_2d0);
  boost::test_tools::output_test_stream::~output_test_stream(local_190);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(license_stdout) {
	boost::test_tools::output_test_stream output;
	{
		cout_redirect guard(output.rdbuf());

		License license(nullptr, MyGlobalFixture::project_path.string());
		license.add_parameter(PARAM_FEATURE_NAMES, "my_fantastic_softwAre");
		license.write_license();
	}
	string stdout_str = output.str();
	BOOST_CHECK_MESSAGE(stdout_str.find("[MY_FANTASTIC_SOFTWARE]") != string::npos,
						"license has been written to stdout " + stdout_str);
}